

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::ChainPromiseNode::get(ChainPromiseNode *this,ExceptionOrValue *output)

{
  Fault f;
  Fault local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if (*(int *)&(this->super_Event).field_0x24 == 1) {
    (*((this->inner).ptr)->_vptr_PromiseNode[2])();
    return;
  }
  local_20.exception = (Exception *)0x0;
  local_18 = 0;
  uStack_10 = 0;
  Debug::Fault::init(&local_20,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
                    );
  Debug::Fault::fatal(&local_20);
}

Assistant:

void ChainPromiseNode::get(ExceptionOrValue& output) noexcept {
  KJ_REQUIRE(state == STEP2);
  return inner->get(output);
}